

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

void __thiscall soul::PoolAllocator::Pool::~Pool(Pool *this)

{
  code *pcVar1;
  ulong uVar2;
  
  if (this->nextSlot != 0) {
    uVar2 = 0;
    do {
      pcVar1 = *(code **)((this->space)._M_elems + uVar2 + 8);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)((this->space)._M_elems + uVar2 + 0x10);
      }
      uVar2 = uVar2 + *(long *)((this->space)._M_elems + uVar2);
    } while (uVar2 < this->nextSlot);
  }
  return;
}

Assistant:

~Pool()
        {
            for (size_t i = 0; i < nextSlot;)
            {
                auto item = getItem (i);

                if (item->destructor != nullptr)
                    item->destructor (&item->item);

                i += item->size;
            }
        }